

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 neon_load_reg(TCGContext_conflict1 *tcg_ctx,int reg,int pass)

{
  uint uVar1;
  TCGTemp *a1;
  uint uVar2;
  
  a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  uVar1 = pass + reg * 2;
  uVar2 = uVar1 * 4;
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(uVar2 & 4) + ((ulong)(uVar2 & 8) | (ulong)(uVar1 >> 2) << 8) + 0xc10);
  return (TCGv_i32)((long)a1 - (long)tcg_ctx);
}

Assistant:

static TCGv_i32 neon_load_reg(TCGContext *tcg_ctx, int reg, int pass)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, tmp, tcg_ctx->cpu_env, neon_reg_offset(reg, pass));
    return tmp;
}